

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

TIFFReadDirEntryErr TIFFReadDirEntryShort(TIFF *tif,TIFFDirEntry *direntry,uint16_t *value)

{
  TIFFReadDirEntryErr TVar1;
  ulong in_RAX;
  int32_t m;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar1 = TIFFReadDirEntryErrType;
  _m = in_RAX;
  switch(direntry->tdir_type) {
  case 1:
    m = (int32_t)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_00250f40_caseD_2;
  case 3:
    TIFFReadDirEntryCheckedShort(tif,direntry,value);
    goto LAB_00250fb7;
  case 4:
    TIFFReadDirEntryCheckedLong(tif,direntry,(uint32_t *)&m);
    goto LAB_00250f96;
  case 6:
    TVar1 = (direntry->tdir_offset).toff_long >> 5 & TIFFReadDirEntryErrRange;
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    m = (int32_t)(char)(direntry->tdir_offset).toff_long;
    break;
  case 8:
    TIFFReadDirEntryCheckedSshort(tif,direntry,(int16_t *)&m);
    TVar1 = (ushort)m >> 0xd & TIFFReadDirEntryErrRange;
    if (((ushort)m >> 0xd & 4) == 0) {
      *value = (ushort)m;
      return TVar1;
    }
    return TVar1;
  case 9:
    TIFFReadDirEntryCheckedSlong(tif,direntry,&m);
LAB_00250f96:
    if (0xffff < (uint)m) {
      return TIFFReadDirEntryErrRange;
    }
    break;
  case 0x10:
    TVar1 = TIFFReadDirEntryCheckedLong8(tif,direntry,(uint64_t *)&m);
    goto LAB_00250f76;
  case 0x11:
    TVar1 = TIFFReadDirEntryCheckedSlong8(tif,direntry,(int64_t *)&m);
LAB_00250f76:
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    if (0xffff < _m) {
      return TIFFReadDirEntryErrRange;
    }
    *value = (uint16_t)_m;
    goto LAB_00250fb7;
  }
  *value = (uint16_t)m;
LAB_00250fb7:
  TVar1 = TIFFReadDirEntryErrOk;
switchD_00250f40_caseD_2:
  return TVar1;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryShort(TIFF *tif, TIFFDirEntry *direntry, uint16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSbyte(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
            TIFFReadDirEntryCheckedShort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSshort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}